

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::erase
          (QMovableArrayOps<QTextLayout::FormatRange> *this,FormatRange *b,qsizetype n)

{
  FormatRange *__src;
  FormatRange *pFVar1;
  FormatRange *pFVar2;
  long lVar3;
  QTextFormat *this_00;
  
  __src = b + n;
  if (n != 0) {
    lVar3 = n * 0x18;
    this_00 = &(b->format).super_QTextFormat;
    do {
      QTextFormat::~QTextFormat(this_00);
      this_00 = (QTextFormat *)&this_00[1].format_type;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  pFVar2 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
           super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
  lVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.size;
  pFVar1 = pFVar2 + lVar3;
  if (__src == pFVar1 || pFVar2 != b) {
    if (__src != pFVar1) {
      memmove(b,__src,(long)pFVar1 - (long)__src);
      lVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
              super_QArrayDataPointer<QTextLayout::FormatRange>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
    super_QArrayDataPointer<QTextLayout::FormatRange>.ptr = __src;
  }
  (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
  super_QArrayDataPointer<QTextLayout::FormatRange>.size = lVar3 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }